

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libunicode.c
# Opt level: O1

int unicode_prop(CharRange *cr,char *prop_name)

{
  uint32_t *puVar1;
  uint uVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  
  uVar2 = unicode_find_name("ASCII_Hex_Digit,AHex",prop_name);
  iVar3 = -2;
  if ((int)uVar2 < 0) {
    return -2;
  }
  switch(uVar2) {
  case 0x22:
    iVar3 = cr->len + 2;
    if ((cr->size < iVar3) && (iVar3 = cr_realloc(cr,iVar3), iVar3 != 0)) {
      return -1;
    }
    puVar1 = cr->points;
    iVar3 = cr->len;
    cr->len = iVar3 + 1;
    puVar1[iVar3] = 0;
    iVar3 = cr->len;
    cr->len = iVar3 + 1;
    puVar1[iVar3] = 0x80;
    goto LAB_00176898;
  case 0x23:
    iVar3 = unicode_prop_ops(cr,0,0x43e,1,4,3,1,3,3,1,2,3,7);
    break;
  case 0x24:
    iVar3 = cr->len + 2;
    if ((cr->size < iVar3) && (iVar3 = cr_realloc(cr,iVar3), iVar3 != 0)) {
      return -1;
    }
    puVar1 = cr->points;
    iVar3 = cr->len;
    cr->len = iVar3 + 1;
    puVar1[iVar3] = 0;
    iVar3 = cr->len;
    cr->len = iVar3 + 1;
    puVar1[iVar3] = 0x110000;
LAB_00176898:
    iVar3 = 0;
    break;
  case 0x25:
    iVar3 = unicode_prop_ops(cr,0,1,6,7);
    return iVar3;
  case 0x26:
    iVar3 = unicode_prop_ops(cr,0,0xe,1,4,3,1,3,3,7);
    break;
  case 0x27:
    uVar5 = 2;
    uVar4 = 4;
    uVar6 = 0xe;
    goto LAB_00176a4d;
  case 0x28:
    iVar3 = 7;
    goto LAB_00176a2b;
  case 0x29:
    iVar3 = 2;
    goto LAB_00176a2b;
  case 0x2a:
    uVar5 = 2;
    uVar4 = 4;
    uVar6 = 0xf;
    goto LAB_00176a4d;
  case 0x2b:
    uVar5 = 2;
    uVar4 = 1;
    uVar6 = 0xd;
    goto LAB_00176a4d;
  case 0x2c:
    iVar3 = 1;
LAB_00176a2b:
    iVar3 = unicode_case1(cr,iVar3);
    return iVar3;
  case 0x2d:
    uVar5 = 0;
    uVar4 = 0x3f000141;
    uVar6 = 5;
    uVar7 = 3;
    uVar8 = 6;
    goto LAB_00176a57;
  case 0x2e:
    uVar4 = 0x140;
    uVar6 = 5;
    goto LAB_001768b8;
  case 0x2f:
    uVar5 = 1;
    uVar4 = 0x30;
    uVar6 = 10;
LAB_00176a4d:
    uVar7 = 5;
LAB_00176a53:
    uVar8 = 7;
LAB_00176a57:
    iVar3 = unicode_prop_ops(cr,uVar5,uVar4,1,uVar6,uVar7,uVar8);
    break;
  case 0x30:
    uVar4 = 4;
    uVar6 = 3;
    goto LAB_001768b8;
  case 0x31:
    uVar4 = 0x1000;
    uVar6 = 1;
    goto LAB_001768b8;
  case 0x32:
    uVar4 = 2;
    uVar6 = 4;
LAB_001768b8:
    uVar5 = 0;
    uVar7 = 3;
    goto LAB_00176a53;
  case 0x33:
    iVar3 = unicode_prop_ops(cr,0,0x106fe,1,7,3,1,8,3,1,0x1d,1,0x1e,3,1,0xc,3,6,4,7);
    break;
  case 0x34:
    iVar3 = unicode_prop_ops(cr,0,0x43e,1,7,3,1,0x1d,1,0x1e,3,1,0xb,3,6,4,7);
    break;
  default:
    if (uVar2 < 0x22) {
      iVar3 = unicode_prop1(cr,uVar2 + 0x10);
      return iVar3;
    }
  }
  return iVar3;
}

Assistant:

int unicode_prop(CharRange *cr, const char *prop_name)
{
    int prop_idx, ret;
    
    prop_idx = unicode_find_name(unicode_prop_name_table, prop_name);
    if (prop_idx < 0)
        return -2;
    prop_idx += UNICODE_PROP_ASCII_Hex_Digit;

    ret = 0;
    switch(prop_idx) {
    case UNICODE_PROP_ASCII:
        if (cr_add_interval(cr, 0x00, 0x7f + 1))
            return -1;
        break;
    case UNICODE_PROP_Any:
        if (cr_add_interval(cr, 0x00000, 0x10ffff + 1))
            return -1;
        break;
    case UNICODE_PROP_Assigned:
        ret = unicode_prop_ops(cr,
                               POP_GC, M(Cn),
                               POP_INVERT,
                               POP_END);
        break;
    case UNICODE_PROP_Math:
        ret = unicode_prop_ops(cr,
                               POP_GC, M(Sm),
                               POP_PROP, UNICODE_PROP_Other_Math,
                               POP_UNION,
                               POP_END);
        break;
    case UNICODE_PROP_Lowercase:
        ret = unicode_prop_ops(cr,
                               POP_GC, M(Ll),
                               POP_PROP, UNICODE_PROP_Other_Lowercase,
                               POP_UNION,
                               POP_END);
        break;
    case UNICODE_PROP_Uppercase:
        ret = unicode_prop_ops(cr,
                               POP_GC, M(Lu),
                               POP_PROP, UNICODE_PROP_Other_Uppercase,
                               POP_UNION,
                               POP_END);
        break;
    case UNICODE_PROP_Cased:
        ret = unicode_prop_ops(cr,
                               POP_GC, M(Lu) | M(Ll) | M(Lt),
                               POP_PROP, UNICODE_PROP_Other_Uppercase,
                               POP_UNION,
                               POP_PROP, UNICODE_PROP_Other_Lowercase,
                               POP_UNION,
                               POP_END);
        break;
    case UNICODE_PROP_Alphabetic:
        ret = unicode_prop_ops(cr,
                               POP_GC, M(Lu) | M(Ll) | M(Lt) | M(Lm) | M(Lo) | M(Nl),
                               POP_PROP, UNICODE_PROP_Other_Uppercase,
                               POP_UNION,
                               POP_PROP, UNICODE_PROP_Other_Lowercase,
                               POP_UNION,
                               POP_PROP, UNICODE_PROP_Other_Alphabetic,
                               POP_UNION,
                               POP_END);
        break;
    case UNICODE_PROP_Grapheme_Base:
        ret = unicode_prop_ops(cr,
                               POP_GC, M(Cc) | M(Cf) | M(Cs) | M(Co) | M(Cn) | M(Zl) | M(Zp) | M(Me) | M(Mn),
                               POP_PROP, UNICODE_PROP_Other_Grapheme_Extend,
                               POP_UNION,
                               POP_INVERT,
                               POP_END);
        break;
    case UNICODE_PROP_Grapheme_Extend:
        ret = unicode_prop_ops(cr,
                               POP_GC, M(Me) | M(Mn),
                               POP_PROP, UNICODE_PROP_Other_Grapheme_Extend,
                               POP_UNION,
                               POP_END);
        break;
    case UNICODE_PROP_XID_Start:
        ret = unicode_prop_ops(cr,
                               POP_GC, M(Lu) | M(Ll) | M(Lt) | M(Lm) | M(Lo) | M(Nl),
                               POP_PROP, UNICODE_PROP_Other_ID_Start,
                               POP_UNION,
                               POP_PROP, UNICODE_PROP_Pattern_Syntax,
                               POP_PROP, UNICODE_PROP_Pattern_White_Space,
                               POP_UNION,
                               POP_PROP, UNICODE_PROP_XID_Start1,
                               POP_UNION,
                               POP_INVERT,
                               POP_INTER,
                               POP_END);
        break;
    case UNICODE_PROP_XID_Continue:
        ret = unicode_prop_ops(cr,
                               POP_GC, M(Lu) | M(Ll) | M(Lt) | M(Lm) | M(Lo) | M(Nl) |
                               M(Mn) | M(Mc) | M(Nd) | M(Pc),
                               POP_PROP, UNICODE_PROP_Other_ID_Start,
                               POP_UNION,
                               POP_PROP, UNICODE_PROP_Other_ID_Continue,
                               POP_UNION,
                               POP_PROP, UNICODE_PROP_Pattern_Syntax,
                               POP_PROP, UNICODE_PROP_Pattern_White_Space,
                               POP_UNION,
                               POP_PROP, UNICODE_PROP_XID_Continue1,
                               POP_UNION,
                               POP_INVERT,
                               POP_INTER,
                               POP_END);
        break;
    case UNICODE_PROP_Changes_When_Uppercased:
        ret = unicode_case1(cr, CASE_U);
        break;
    case UNICODE_PROP_Changes_When_Lowercased:
        ret = unicode_case1(cr, CASE_L);
        break;
    case UNICODE_PROP_Changes_When_Casemapped:
        ret = unicode_case1(cr, CASE_U | CASE_L | CASE_F);
        break;
    case UNICODE_PROP_Changes_When_Titlecased:
        ret = unicode_prop_ops(cr,
                               POP_CASE, CASE_U,
                               POP_PROP, UNICODE_PROP_Changes_When_Titlecased1,
                               POP_XOR,
                               POP_END);
        break;
    case UNICODE_PROP_Changes_When_Casefolded:
        ret = unicode_prop_ops(cr,
                               POP_CASE, CASE_F,
                               POP_PROP, UNICODE_PROP_Changes_When_Casefolded1,
                               POP_XOR,
                               POP_END);
        break;
    case UNICODE_PROP_Changes_When_NFKC_Casefolded:
        ret = unicode_prop_ops(cr,
                               POP_CASE, CASE_F,
                               POP_PROP, UNICODE_PROP_Changes_When_NFKC_Casefolded1,
                               POP_XOR,
                               POP_END);
        break;
#if 0
    case UNICODE_PROP_ID_Start:
        ret = unicode_prop_ops(cr,
                               POP_GC, M(Lu) | M(Ll) | M(Lt) | M(Lm) | M(Lo) | M(Nl),
                               POP_PROP, UNICODE_PROP_Other_ID_Start,
                               POP_UNION,
                               POP_PROP, UNICODE_PROP_Pattern_Syntax,
                               POP_PROP, UNICODE_PROP_Pattern_White_Space,
                               POP_UNION,
                               POP_INVERT,
                               POP_INTER,
                               POP_END);
        break;
    case UNICODE_PROP_ID_Continue:
        ret = unicode_prop_ops(cr,
                               POP_GC, M(Lu) | M(Ll) | M(Lt) | M(Lm) | M(Lo) | M(Nl) |
                               M(Mn) | M(Mc) | M(Nd) | M(Pc),
                               POP_PROP, UNICODE_PROP_Other_ID_Start,
                               POP_UNION,
                               POP_PROP, UNICODE_PROP_Other_ID_Continue,
                               POP_UNION,
                               POP_PROP, UNICODE_PROP_Pattern_Syntax,
                               POP_PROP, UNICODE_PROP_Pattern_White_Space,
                               POP_UNION,
                               POP_INVERT,
                               POP_INTER,
                               POP_END);
        break;
    case UNICODE_PROP_Case_Ignorable:
        ret = unicode_prop_ops(cr,
                               POP_GC, M(Mn) | M(Cf) | M(Lm) | M(Sk),
                               POP_PROP, UNICODE_PROP_Case_Ignorable1,
                               POP_XOR,
                               POP_END);
        break;
#else
        /* we use the existing tables */
    case UNICODE_PROP_ID_Continue:
        ret = unicode_prop_ops(cr,
                               POP_PROP, UNICODE_PROP_ID_Start,
                               POP_PROP, UNICODE_PROP_ID_Continue1,
                               POP_XOR,
                               POP_END);
        break;
#endif
    default:
        if (prop_idx >= countof(unicode_prop_table))
            return -2;
        ret = unicode_prop1(cr, prop_idx);
        break;
    }
    return ret;
}